

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O3

string * JoinList(string *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *arg,bool escape)

{
  string *psVar1;
  int in_ECX;
  undefined7 in_register_00000011;
  cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_20;
  
  local_20.End.Base._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT71(in_register_00000011,escape);
  local_20.Begin.Base._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg;
  if (in_ECX == 0) {
    local_20.Begin.Func =
         (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *)local_20.End.Base._M_current;
    psVar1 = cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                       (__return_storage_ptr__,
                        (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&local_20,";");
  }
  else {
    local_20.Begin.Func = EscapeArg;
    local_20.End.Func = EscapeArg;
    psVar1 = cmJoin<cmRange<RangeIterators::TransformIterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string(*)(std::__cxx11::string_const&)>>>
                       (__return_storage_ptr__,&local_20,";");
  }
  return psVar1;
}

Assistant:

static std::string JoinList(std::vector<std::string> const& arg, bool escape)
{
  return escape ? cmJoin(cmMakeRange(arg).transform(EscapeArg), ";")
                : cmJoin(cmMakeRange(arg), ";");
}